

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O2

int32_t ecs_get_child_count(ecs_world_t *world,ecs_entity_t entity)

{
  uint uVar1;
  int32_t iVar2;
  ecs_vector_t *vector;
  void *pvVar3;
  ulong uVar4;
  int32_t iVar5;
  ulong uVar6;
  
  vector = (ecs_vector_t *)_ecs_map_get_ptr(world->child_tables,entity);
  if (vector == (ecs_vector_t *)0x0) {
    iVar5 = 0;
  }
  else {
    uVar1 = ecs_vector_count(vector);
    pvVar3 = _ecs_vector_first(vector,8,0x10);
    uVar6 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar6;
    }
    iVar5 = 0;
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = ecs_table_count(*(ecs_table_t **)((long)pvVar3 + uVar6 * 8));
      iVar5 = iVar5 + iVar2;
    }
  }
  return iVar5;
}

Assistant:

int32_t ecs_get_child_count(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    ecs_vector_t *tables = ecs_map_get_ptr(world->child_tables, ecs_vector_t*, entity);
    if (!tables) {
        return 0;
    } else {
        int32_t count = 0;

        ecs_vector_each(tables, ecs_table_t*, table_ptr, {
            ecs_table_t *table = *table_ptr;
            count += ecs_table_count(table);
        });

        return count;
    }
}